

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> * __thiscall
kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
          (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this,
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other)

{
  PromiseArenaMember *node;
  PromiseNode *ptrCopy;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other_local;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_local;
  
  node = &this->ptr->super_PromiseArenaMember;
  this->ptr = other->ptr;
  other->ptr = (PromiseNode *)0x0;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assignnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    T* ptrCopy = ptr;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      StaticDisposer::dispose(ptrCopy);
    }
    return *this;
  }